

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O3

void CMWriteQueuedData(transport_entry_conflict trans,CMConnection conn)

{
  queued_data_rec *__dest;
  char **ppcVar1;
  CMbuffer p_Var2;
  FFSEncodeVector pFVar3;
  int iVar4;
  __pid_t _Var5;
  FFSEncodeVector pFVar6;
  pthread_t pVar7;
  size_t sVar8;
  size_t __n;
  long lVar9;
  char *__format;
  FILE *pFVar10;
  FFSEncodeVector pFVar11;
  size_t sVar12;
  long lVar13;
  timespec ts;
  timespec ts_1;
  timespec local_58;
  timespec local_40;
  
  if (conn->cm->CMTrace_file == (FILE *)0x0) {
    iVar4 = CMtrace_init(conn->cm,CMLowLevelVerbose);
    if (iVar4 != 0) goto LAB_0011ef32;
  }
  else if (CMtrace_val[3] != 0) {
LAB_0011ef32:
    if (CMtrace_PID != 0) {
      pFVar10 = (FILE *)conn->cm->CMTrace_file;
      _Var5 = getpid();
      pVar7 = pthread_self();
      fprintf(pFVar10,"P%lxT%lx - ",(long)_Var5,pVar7);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_58);
      fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_58.tv_sec,local_58.tv_nsec);
    }
    fprintf((FILE *)conn->cm->CMTrace_file,"CMWriteQueuedData, conn %p, header %zd, attr %zd\n",conn
            ,(conn->queued_data).rem_header_len,(conn->queued_data).rem_attr_len);
  }
  fflush((FILE *)conn->cm->CMTrace_file);
  sVar12 = (conn->queued_data).rem_header_len;
  if (sVar12 == 0) {
LAB_0011f067:
    sVar12 = (conn->queued_data).rem_attr_len;
    if (sVar12 != 0) {
      local_58.tv_sec = (__time_t)(conn->queued_data).rem_attr_base;
      local_58.tv_nsec = sVar12;
      iVar4 = (*trans->NBwritev_func)
                        (&CMstatic_trans_svcs,conn->transport_data,&local_58,1,(attr_list)0x0);
      if (iVar4 == -1) goto LAB_0011f174;
      lVar9 = (long)iVar4;
      sVar12 = (conn->queued_data).rem_attr_len;
      sVar8 = sVar12 - lVar9;
      if (sVar8 != 0 && lVar9 <= (long)sVar12) {
        (conn->queued_data).rem_attr_len = sVar8;
        ppcVar1 = &(conn->queued_data).rem_attr_base;
        *ppcVar1 = *ppcVar1 + lVar9;
        iVar4 = CMtrace_val[3];
        if (conn->cm->CMTrace_file == (FILE *)0x0) {
          iVar4 = CMtrace_init(conn->cm,CMLowLevelVerbose);
        }
        if (iVar4 == 0) goto LAB_0011f440;
        if (CMtrace_PID != 0) {
          pFVar10 = (FILE *)conn->cm->CMTrace_file;
          _Var5 = getpid();
          pVar7 = pthread_self();
          fprintf(pFVar10,"P%lxT%lx - ",(long)_Var5,pVar7);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_40);
          fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
        }
        sVar12 = (conn->queued_data).rem_attr_len;
        pFVar10 = (FILE *)conn->cm->CMTrace_file;
        __format = "CMWriteQueuedData, conn %p, remaining attr %zd\n";
        goto LAB_0011f439;
      }
    }
    pFVar11 = (conn->queued_data).vector_data;
    if (pFVar11 != (FFSEncodeVector)0x0) {
      if (pFVar11->iov_base == (void *)0x0) {
        sVar12 = 0;
        lVar9 = 0;
      }
      else {
        lVar9 = 0;
        sVar12 = 0;
        pFVar3 = pFVar11;
        do {
          pFVar6 = pFVar3 + 1;
          sVar12 = sVar12 + 1;
          lVar9 = lVar9 + pFVar3->iov_len;
          pFVar3 = pFVar6;
        } while (pFVar6->iov_base != (void *)0x0);
      }
      iVar4 = (*trans->NBwritev_func)
                        (&CMstatic_trans_svcs,conn->transport_data,pFVar11,sVar12,(attr_list)0x0);
      if (iVar4 == -1) goto LAB_0011f174;
      lVar13 = (long)iVar4;
      if (lVar13 < lVar9) {
        iVar4 = CMtrace_val[3];
        if (conn->cm->CMTrace_file == (FILE *)0x0) {
          iVar4 = CMtrace_init(conn->cm,CMLowLevelVerbose);
        }
        if (iVar4 != 0) {
          if (CMtrace_PID != 0) {
            pFVar10 = (FILE *)conn->cm->CMTrace_file;
            _Var5 = getpid();
            pVar7 = pthread_self();
            fprintf(pFVar10,"P%lxT%lx - ",(long)_Var5,pVar7);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_58);
            fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_58.tv_sec,local_58.tv_nsec)
            ;
          }
          fprintf((FILE *)conn->cm->CMTrace_file,"Continued partial pending write, %zu bytes sent\n"
                  ,lVar13);
        }
        fflush((FILE *)conn->cm->CMTrace_file);
        sVar8 = pFVar11->iov_len;
        if ((long)sVar8 < lVar13) {
          do {
            lVar13 = lVar13 - sVar8;
            sVar12 = sVar12 - 1;
            sVar8 = pFVar11[1].iov_len;
            pFVar11 = pFVar11 + 1;
          } while ((long)sVar8 < lVar13);
        }
        pFVar11->iov_len = sVar8 - lVar13;
        pFVar11->iov_base = (void *)((long)pFVar11->iov_base + lVar13);
        (conn->queued_data).vector_data = pFVar11;
        iVar4 = CMtrace_val[3];
        if (conn->cm->CMTrace_file == (FILE *)0x0) {
          iVar4 = CMtrace_init(conn->cm,CMLowLevelVerbose);
        }
        if (iVar4 == 0) goto LAB_0011f440;
        if (CMtrace_PID != 0) {
          pFVar10 = (FILE *)conn->cm->CMTrace_file;
          _Var5 = getpid();
          pVar7 = pthread_self();
          fprintf(pFVar10,"P%lxT%lx - ",(long)_Var5,pVar7);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_58);
          fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_58.tv_sec,local_58.tv_nsec);
        }
        pFVar10 = (FILE *)conn->cm->CMTrace_file;
        __format = "CMWriteQueuedData, conn %p, %zu remaining data vectors\n";
        goto LAB_0011f439;
      }
    }
    p_Var2 = (conn->queued_data).buffer_to_free;
    if (p_Var2 != (CMbuffer)0x0) {
      cm_return_data_buf(conn->cm,p_Var2);
    }
    conn->write_pending = 0;
    (*conn->trans->set_write_notify)(conn->trans,&CMstatic_trans_svcs,conn->transport_data,0);
    iVar4 = CManager_locked(conn->cm);
    if (iVar4 == 0) {
      puts("Not LOCKED in write queued data!");
    }
  }
  else {
    __dest = &conn->queued_data;
    local_58.tv_sec = (__time_t)__dest;
    local_58.tv_nsec = sVar12;
    iVar4 = (*trans->NBwritev_func)
                      (&CMstatic_trans_svcs,conn->transport_data,&local_58,1,(attr_list)0x0);
    if (iVar4 != -1) {
      lVar9 = (long)iVar4;
      sVar12 = (conn->queued_data).rem_header_len;
      __n = sVar12 - lVar9;
      if (__n == 0 || (long)sVar12 < lVar9) goto LAB_0011f067;
      (conn->queued_data).rem_header_len = __n;
      memmove(__dest,__dest->rem_header + lVar9,__n);
      iVar4 = CMtrace_val[3];
      if (conn->cm->CMTrace_file == (FILE *)0x0) {
        iVar4 = CMtrace_init(conn->cm,CMLowLevelVerbose);
      }
      if (iVar4 == 0) goto LAB_0011f440;
      if (CMtrace_PID != 0) {
        pFVar10 = (FILE *)conn->cm->CMTrace_file;
        _Var5 = getpid();
        pVar7 = pthread_self();
        fprintf(pFVar10,"P%lxT%lx - ",(long)_Var5,pVar7);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_40);
        fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
      }
      sVar12 = (conn->queued_data).rem_header_len;
      pFVar10 = (FILE *)conn->cm->CMTrace_file;
      __format = "CMWriteQueuedData, conn %p, remaining header %zd\n";
LAB_0011f439:
      fprintf(pFVar10,__format,conn,sVar12);
LAB_0011f440:
      fflush((FILE *)conn->cm->CMTrace_file);
      return;
    }
LAB_0011f174:
    iVar4 = CMtrace_val[7];
    if (conn->cm->CMTrace_file == (FILE *)0x0) {
      iVar4 = CMtrace_init(conn->cm,CMFreeVerbose);
    }
    if (iVar4 != 0) {
      if (CMtrace_PID != 0) {
        pFVar10 = (FILE *)conn->cm->CMTrace_file;
        _Var5 = getpid();
        pVar7 = pthread_self();
        fprintf(pFVar10,"P%lxT%lx - ",(long)_Var5,pVar7);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_58);
        fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_58.tv_sec,local_58.tv_nsec);
      }
      fprintf((FILE *)conn->cm->CMTrace_file,
              "Calling write failed connection failed with dereference %p\n",conn);
    }
    fflush((FILE *)conn->cm->CMTrace_file);
    INT_CMConnection_failed(conn);
    p_Var2 = (conn->queued_data).buffer_to_free;
    if (p_Var2 != (CMbuffer)0x0) {
      cm_return_data_buf(conn->cm,p_Var2);
      (conn->queued_data).buffer_to_free = (CMbuffer)0x0;
    }
    conn->write_pending = 0;
    (*conn->trans->set_write_notify)(conn->trans,&CMstatic_trans_svcs,conn->transport_data,0);
  }
  cm_wake_any_pending_write(conn);
  return;
}

Assistant:

extern void CMWriteQueuedData(transport_entry trans, CMConnection conn)
 {
     attr_list attrs = NULL;  /* GSE fix */
     CMtrace_out(conn->cm, CMLowLevelVerbose, "CMWriteQueuedData, conn %p, header %zd, attr %zd\n", 
		 conn, conn->queued_data.rem_header_len, 
		 conn->queued_data.rem_attr_len);
     if (conn->queued_data.rem_header_len != 0) {
	 struct FFSEncodeVec tmp_vec[1];
	 ssize_t actual;
	 tmp_vec[0].iov_base = conn->queued_data.rem_header;
	 tmp_vec[0].iov_len = conn->queued_data.rem_header_len;
	 actual = trans->NBwritev_func(&CMstatic_trans_svcs,
					    conn->transport_data,
					    &tmp_vec[0], 1,
					    attrs);
	 if (actual == -1) {
	     goto failed;
	 }
	 if (actual < (ssize_t)conn->queued_data.rem_header_len) {
	     conn->queued_data.rem_header_len -= actual;
	     memmove(&conn->queued_data.rem_header[0],
		     &conn->queued_data.rem_header[actual],
		     conn->queued_data.rem_header_len);
	     CMtrace_out(conn->cm, CMLowLevelVerbose, "CMWriteQueuedData, conn %p, remaining header %zd\n", 
			 conn, conn->queued_data.rem_header_len);
	     return;
	 }
     }
     if (conn->queued_data.rem_attr_len != 0) {
	 struct FFSEncodeVec tmp_vec[1];
	 ssize_t actual;
	 tmp_vec[0].iov_base = conn->queued_data.rem_attr_base;
	 tmp_vec[0].iov_len = conn->queued_data.rem_attr_len;
	 actual = trans->NBwritev_func(&CMstatic_trans_svcs,
					    conn->transport_data,
					    &tmp_vec[0], 1,
					    attrs);
	 if (actual == -1) {
	     goto failed;
	 }
	 if (actual < (ssize_t)conn->queued_data.rem_attr_len) {
	     conn->queued_data.rem_attr_len -= actual;
	     conn->queued_data.rem_attr_base += actual;
	     CMtrace_out(conn->cm, CMLowLevelVerbose, "CMWriteQueuedData, conn %p, remaining attr %zd\n", 
			 conn, conn->queued_data.rem_attr_len);
	     return;
	 }
     }
     if (conn->queued_data.vector_data) {
	 size_t vec_count = 0;
	 size_t length = 0;
	 FFSEncodeVector vec = conn->queued_data.vector_data;
	 ssize_t actual = 0;

	 while(vec[vec_count].iov_base != NULL) {
	     length += vec[vec_count].iov_len;
	     vec_count++;
	 }
	 actual = trans->NBwritev_func(&CMstatic_trans_svcs,
					    conn->transport_data,
					    vec, vec_count,
					    attrs);
	 if (actual == -1) {
	     goto failed;
	 }
	 if (actual < (ssize_t)length) {
	     int i = 0;
	     CMtrace_out(conn->cm, CMLowLevelVerbose, "Continued partial pending write, %zu bytes sent\n", actual);
	     while (actual > (ssize_t)vec[i].iov_len) {
		 actual -= vec[i].iov_len;
		 i++;
		 vec_count--;
	     }
	     vec[i].iov_len -= actual;
	     vec[i].iov_base = (char*)vec[i].iov_base + actual;
	     conn->queued_data.vector_data = &vec[i];
	     CMtrace_out(conn->cm, CMLowLevelVerbose, "CMWriteQueuedData, conn %p, %zu remaining data vectors\n", 
			 conn, vec_count);
	     return;
	 }
     }
     if (conn->queued_data.buffer_to_free) {
	 cm_return_data_buf(conn->cm, conn->queued_data.buffer_to_free);
     }
     conn->write_pending = 0;
     conn->trans->set_write_notify(conn->trans, &CMstatic_trans_svcs, 
				   conn->transport_data, 0);

     if(!CManager_locked(conn->cm)) {
	 printf("Not LOCKED in write queued data!\n");
     }
     cm_wake_any_pending_write(conn);
     return;
  failed:
     CMtrace_out(conn->cm, CMFreeVerbose, "Calling write failed connection failed with dereference %p\n", conn);
     INT_CMConnection_failed(conn);
     if (conn->queued_data.buffer_to_free) {
	 cm_return_data_buf(conn->cm, conn->queued_data.buffer_to_free);
	 conn->queued_data.buffer_to_free = NULL;
     }
     conn->write_pending = 0;
     conn->trans->set_write_notify(conn->trans, &CMstatic_trans_svcs, 
				   conn->transport_data, 0);
     cm_wake_any_pending_write(conn);
     return;
 }